

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_addclause(sat_solver *s,lit *begin,lit *end)

{
  uint *pEnd;
  lit lVar1;
  uint *pBeg;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint *puVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  if (end <= begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x5f0,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  if ((s->temp_clause).size < 0) {
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->temp_clause).size = 0;
  if (begin < end) {
    do {
      lVar1 = *begin;
      uVar8 = (s->temp_clause).cap;
      if ((s->temp_clause).size == uVar8) {
        iVar3 = (uVar8 >> 1) * 3;
        if ((int)uVar8 < 4) {
          iVar3 = uVar8 * 2;
        }
        piVar4 = (s->temp_clause).ptr;
        if (piVar4 == (int *)0x0) {
          piVar4 = (int *)malloc((long)iVar3 << 2);
        }
        else {
          piVar4 = (int *)realloc(piVar4,(long)iVar3 << 2);
        }
        (s->temp_clause).ptr = piVar4;
        if (piVar4 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_clause).cap * 9.5367431640625e-07,
                 (double)iVar3 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_clause).cap = iVar3;
      }
      iVar3 = (s->temp_clause).size;
      (s->temp_clause).size = iVar3 + 1;
      (s->temp_clause).ptr[iVar3] = lVar1;
      begin = begin + 1;
    } while (begin < end);
  }
  pBeg = (uint *)(s->temp_clause).ptr;
  iVar3 = (s->temp_clause).size;
  iVar7 = (int)*pBeg >> 1;
  pEnd = pBeg + iVar3;
  if (1 < (long)iVar3) {
    puVar5 = pBeg + 1;
    do {
      uVar8 = *puVar5;
      puVar6 = puVar5;
      iVar2 = (int)uVar8 >> 1;
      if ((int)uVar8 >> 1 <= iVar7) {
        iVar2 = iVar7;
      }
      for (; (iVar7 = iVar2, pBeg < puVar6 && ((int)uVar8 < (int)puVar6[-1])); puVar6 = puVar6 + -1)
      {
        *puVar6 = puVar6[-1];
        iVar2 = iVar7;
      }
      *puVar6 = uVar8;
      puVar5 = puVar5 + 1;
    } while (puVar5 < pEnd);
  }
  sat_solver_setnvars(s,iVar7 + 1);
  if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
     (iVar7 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)pBeg,(lit *)pEnd), iVar7 == 0)) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x60e,"int sat_solver_addclause(sat_solver *, lit *, lit *)");
  }
  puVar5 = pBeg;
  if (0 < iVar3) {
    uVar8 = 0xfffffffe;
    puVar6 = pBeg;
    do {
      uVar9 = *puVar6;
      if ((uVar9 ^ uVar8) == 1) {
        return 1;
      }
      if ((uVar9 & 1) == (int)s->assigns[(int)uVar9 >> 1]) {
        return 1;
      }
      if (s->assigns[(int)uVar9 >> 1] == '\x03' && uVar9 != uVar8) {
        *puVar5 = uVar9;
        puVar5 = puVar5 + 1;
        uVar8 = uVar9;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 < pEnd);
  }
  if (puVar5 == pBeg) {
    iVar3 = 0;
  }
  else {
    if ((long)puVar5 - (long)pBeg == 4) {
      uVar8 = *pBeg;
      iVar3 = (int)uVar8 >> 1;
      if (s->pFreqs[iVar3] == '\0') {
        s->pFreqs[iVar3] = '\x01';
      }
      uVar9 = (uint)s->assigns[iVar3];
      if (uVar9 != 3) {
        return (uint)((uVar8 & 1) == uVar9);
      }
      s->assigns[iVar3] = (byte)uVar8 & 1;
      s->levels[iVar3] = (s->trail_lim).size;
      s->reasons[iVar3] = 0;
      iVar3 = s->qtail;
      s->qtail = iVar3 + 1;
      s->trail[iVar3] = uVar8;
    }
    else {
      sat_solver_clause_new(s,(lit *)pBeg,(lit *)puVar5,0);
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int sat_solver_addclause(sat_solver* s, lit* begin, lit* end)
{
    int fVerbose = 0;
    lit *i,*j;
    int maxvar;
    lit last;
    assert( begin < end );
    if ( fVerbose )
    {
        for ( i = begin; i < end; i++ )
            printf( "%s%d ", (*i)&1 ? "!":"", (*i)>>1 );
        printf( "\n" );
    }

    veci_resize( &s->temp_clause, 0 );
    for ( i = begin; i < end; i++ )
        veci_push( &s->temp_clause, *i );
    begin = veci_begin( &s->temp_clause );
    end = begin + veci_size( &s->temp_clause );

    // insertion sort
    maxvar = lit_var(*begin);
    for (i = begin + 1; i < end; i++){
        lit l = *i;
        maxvar = lit_var(l) > maxvar ? lit_var(l) : maxvar;
        for (j = i; j > begin && *(j-1) > l; j--)
            *j = *(j-1);
        *j = l;
    }
    sat_solver_setnvars(s,maxvar+1);

    ///////////////////////////////////
    // add clause to internal storage
    if ( s->pStore )
    {
        int RetValue = Sto_ManAddClause( (Sto_Man_t *)s->pStore, begin, end );
        assert( RetValue );
        (void) RetValue;
    }
    ///////////////////////////////////

    // delete duplicates
    last = lit_Undef;
    for (i = j = begin; i < end; i++){
        //printf("lit: "L_LIT", value = %d\n", L_lit(*i), (lit_sign(*i) ? -s->assignss[lit_var(*i)] : s->assignss[lit_var(*i)]));
        if (*i == lit_neg(last) || var_value(s, lit_var(*i)) == lit_sign(*i))
            return true;   // tautology
        else if (*i != last && var_value(s, lit_var(*i)) == varX)
            last = *j++ = *i;
    }
//    j = i;

    if (j == begin)          // empty clause
        return false;

    if (j - begin == 1) // unit clause
        return sat_solver_enqueue(s,*begin,0);

    // create new clause
    sat_solver_clause_new(s,begin,j,0);
    return true;
}